

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O1

void __thiscall Centaurus::LookaheadDFA<wchar_t>::minimize(LookaheadDFA<wchar_t> *this)

{
  pointer pLVar1;
  pointer pNVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pLVar6;
  iterator iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  iterator __begin0;
  pointer pLVar11;
  pointer pNVar12;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  vector<bool,_std::allocator<bool>_> mask;
  vector<int,_std::allocator<int>_> remap;
  unordered_map<Centaurus::LDFAState<wchar_t>,_int,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>_>
  equiv_map;
  int local_ac;
  vector<bool,_std::allocator<bool>_> local_a8;
  vector<int,_std::allocator<int>_> local_80;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  local_68[0] = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a8,
             ((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
             (bool *)local_68,(allocator_type *)&local_80);
  local_68._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,
             ((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                    super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
             (value_type_conflict *)local_68,(allocator_type *)&local_ac);
  local_68._0_8_ = local_40 + 8;
  local_68._8_8_ = 1;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  local_ac = 0;
  pLVar6 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
           super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
      super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pLVar6) {
    uVar9 = 0;
  }
  else {
    uVar8 = 0;
    do {
      iVar7 = std::
              _Hashtable<Centaurus::LDFAState<wchar_t>,_std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<Centaurus::LDFAState<wchar_t>,_std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_68,pLVar6 + uVar8);
      if (iVar7.super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<Centaurus::LDFAState<wchar_t>,std::pair<Centaurus::LDFAState<wchar_t>const,int>,std::allocator<std::pair<Centaurus::LDFAState<wchar_t>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::LDFAState<wchar_t>>,std::hash<Centaurus::LDFAState<wchar_t>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<Centaurus::LDFAState<wchar_t>&,int&>
                  ((_Hashtable<Centaurus::LDFAState<wchar_t>,std::pair<Centaurus::LDFAState<wchar_t>const,int>,std::allocator<std::pair<Centaurus::LDFAState<wchar_t>const,int>>,std::__detail::_Select1st,std::equal_to<Centaurus::LDFAState<wchar_t>>,std::hash<Centaurus::LDFAState<wchar_t>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_68,
                   (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_ac,&local_ac);
      }
      else {
        local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_ac] =
             *(int *)((long)iVar7.
                            super__Node_iterator_base<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_true>
                            ._M_cur + 0x58);
        uVar8 = (ulong)local_ac;
        uVar9 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar9 = uVar8;
        }
        bVar3 = (byte)local_ac & 0x3f;
        local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar9 >> 6) + ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar9 >> 6) + ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)]
             & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar8 = (long)local_ac + 1;
      local_ac = (int)uVar8;
      pLVar6 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
               super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                     super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar6 >> 4) *
              -0x3333333333333333;
    } while (uVar8 <= uVar9 && uVar9 - uVar8 != 0);
  }
  if (uVar9 != 0) {
    pLVar1 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = 0;
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx512f(_DAT_001602a0);
    auVar19 = vpmovsxwd_avx512f(_DAT_001602c0);
    do {
      if (-1 < local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8] && pLVar6 != pLVar1) {
        auVar20 = vpbroadcastq_avx512f();
        auVar21 = vpbroadcastd_avx512f();
        pLVar11 = pLVar6;
        do {
          pNVar12 = (pLVar11->
                    super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                    ).m_transitions.
                    super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar2 = (pLVar11->
                   super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                   ).m_transitions.
                   super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pNVar12 != pNVar2) {
            uVar10 = (ulong)((long)pNVar2 + (-0x38 - (long)pNVar12)) / 0x38 + 0x10 &
                     0xfffffffffffffff0;
            auVar22 = vpbroadcastq_avx512f();
            uVar13 = 0;
            do {
              auVar23 = vpbroadcastq_avx512f();
              auVar24 = vporq_avx512f(auVar23,auVar17);
              auVar23 = vporq_avx512f(auVar23,auVar18);
              uVar4 = vpcmpuq_avx512f(auVar23,auVar22,2);
              uVar5 = vpcmpuq_avx512f(auVar24,auVar22,2);
              bVar3 = (byte)uVar5;
              uVar14 = CONCAT11(bVar3,(byte)uVar4);
              auVar23 = vpgatherdd_avx512f(*(undefined4 *)((long)&pNVar12->m_dest + uVar10));
              auVar15._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar23._4_4_;
              auVar15._0_4_ = (uint)((byte)uVar4 & 1) * auVar23._0_4_;
              auVar15._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar23._8_4_;
              auVar15._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar23._12_4_;
              auVar15._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar23._16_4_;
              auVar15._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar23._20_4_;
              auVar15._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar23._24_4_;
              auVar15._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar23._28_4_;
              auVar24._32_4_ = (uint)(bVar3 & 1) * auVar23._32_4_;
              auVar24._0_32_ = auVar15;
              auVar24._36_4_ = (uint)(bVar3 >> 1 & 1) * auVar23._36_4_;
              auVar24._40_4_ = (uint)(bVar3 >> 2 & 1) * auVar23._40_4_;
              auVar24._44_4_ = (uint)(bVar3 >> 3 & 1) * auVar23._44_4_;
              auVar24._48_4_ = (uint)(bVar3 >> 4 & 1) * auVar23._48_4_;
              auVar24._52_4_ = (uint)(bVar3 >> 5 & 1) * auVar23._52_4_;
              auVar24._56_4_ = (uint)(bVar3 >> 6 & 1) * auVar23._56_4_;
              auVar24._60_4_ = (uint)(bVar3 >> 7) * auVar23._60_4_;
              auVar16 = vextracti64x4_avx512f(auVar24,1);
              auVar23 = vpmovzxdq_avx512f(auVar16);
              auVar24 = vpmovzxdq_avx512f(auVar15);
              uVar4 = vpcmpeqq_avx512f(auVar20,auVar24);
              uVar5 = vpcmpeqq_avx512f(auVar20,auVar23);
              vpscatterdd_avx512f(ZEXT864(pNVar12) + auVar19,
                                  (ulong)(uVar14 & CONCAT11((char)uVar5,(char)uVar4)),auVar21);
              uVar13 = uVar13 + 0x10;
              pNVar12 = pNVar12 + 0x10;
            } while (uVar10 != uVar13);
          }
          pLVar11 = pLVar11 + 1;
        } while (pLVar11 != pLVar1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
  }
  filter_nodes(this,&local_a8);
  std::
  _Hashtable<Centaurus::LDFAState<wchar_t>,_std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<Centaurus::LDFAState<wchar_t>,_std::pair<const_Centaurus::LDFAState<wchar_t>,_int>,_std::allocator<std::pair<const_Centaurus::LDFAState<wchar_t>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::LDFAState<wchar_t>_>,_std::hash<Centaurus::LDFAState<wchar_t>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void minimize()
    {
        std::vector<bool> mask(m_states.size(), true);
        std::vector<int> remap(m_states.size(), -1);

        std::unordered_map<LDFAState<TCHAR>, int> equiv_map;

        for (int index = 0; index < m_states.size(); index++)
        {
            auto p = equiv_map.find(m_states[index]);
            if (p != equiv_map.end())
            {
                remap[index] = p->second;
                mask[index] = false;
            }
            else
            {
                equiv_map.emplace(m_states[index], index);
            }
        }

        for (int index = 0; index < m_states.size(); index++)
        {
            if (remap[index] >= 0)
            {
                redirect_transitions(index, remap[index]);
            }
        }
        filter_nodes(mask);
    }